

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4f553::IntrusiveListIteratorTest::~IntrusiveListIteratorTest
          (IntrusiveListIteratorTest *this)

{
  code *pcVar1;
  IntrusiveListIteratorTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual void SetUp() {
    IntrusiveListTest::SetUp();

    list_.emplace_back(1);
    list_.emplace_back(2);
    list_.emplace_back(3);
  }